

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O1

uint m68k_is_valid_instruction(uint instruction,uint cpu_type)

{
  _func_void *p_Var1;
  uint uVar2;
  
  if (g_initialized == '\0') {
    build_opcode_table();
    g_initialized = '\x01';
  }
  p_Var1 = g_instruction_table[instruction & 0xffff];
  uVar2 = 0;
  if (p_Var1 == d68000_illegal) {
    return 0;
  }
  switch(cpu_type) {
  case 1:
    if (p_Var1 == d68010_rtd) {
      return 0;
    }
    if (p_Var1 == d68010_moves_32) {
      return 0;
    }
    if (p_Var1 == d68010_moves_16) {
      return 0;
    }
    if (p_Var1 == d68010_moves_8) {
      return 0;
    }
    if (p_Var1 == d68010_movec) {
      return 0;
    }
    if (p_Var1 == d68010_bkpt) {
      return 0;
    }
    if (p_Var1 == d68010_move_fr_ccr) {
      return 0;
    }
    break;
  case 2:
    break;
  case 3:
  case 4:
  case 5:
  case 6:
    goto switchD_003f9fbf_caseD_3;
  case 7:
  case 8:
  case 9:
    goto switchD_003f9fbf_caseD_7;
  default:
    goto switchD_003f9fbf_default;
  }
  if (((((((p_Var1 != d68020_unpk_mm) && (p_Var1 != d68020_unpk_rr)) && (p_Var1 != d68020_tst_i_32))
        && (((p_Var1 != d68020_tst_pcix_32 && (p_Var1 != d68020_tst_pcdi_32)) &&
            ((p_Var1 != d68020_tst_a_32 &&
             ((p_Var1 != d68020_tst_i_16 && (p_Var1 != d68020_tst_pcix_16)))))))) &&
       ((p_Var1 != d68020_tst_pcdi_16 &&
        ((((p_Var1 != d68020_tst_a_16 && (p_Var1 != d68020_tst_i_8)) &&
          (p_Var1 != d68020_tst_pcix_8)) &&
         ((p_Var1 != d68020_tst_pcdi_8 && (p_Var1 != d68020_trapcc_32)))))))) &&
      (((((p_Var1 != d68020_trapcc_16 && ((p_Var1 != d68020_trapcc_0 && (p_Var1 != d68020_rtm)))) &&
         (p_Var1 != d68020_pack_mm)) &&
        (((p_Var1 != d68020_pack_rr && (p_Var1 != d68020_mull)) && (p_Var1 != d68020_link_32)))) &&
       (((p_Var1 != d68020_extb_32 && (p_Var1 != d68020_divl)) &&
        ((p_Var1 != d68020_cptrapcc_32 &&
         ((p_Var1 != d68020_cptrapcc_16 && (p_Var1 != d68020_cptrapcc_0)))))))))) &&
     (((((p_Var1 != d68020_cpscc &&
         ((((p_Var1 != d68020_cpsave && (p_Var1 != d68020_cprestore)) && (p_Var1 != d68020_cpgen))
          && (((p_Var1 != d68020_cpdbcc && (p_Var1 != d68020_cpbcc_32)) &&
              ((p_Var1 != d68020_cpbcc_16 &&
               ((p_Var1 != d68020_cmpi_pcix_32 && (p_Var1 != d68020_cmpi_pcdi_32)))))))))) &&
        (p_Var1 != d68020_cmpi_pcix_16)) &&
       (((((((((p_Var1 != d68020_cmpi_pcdi_16 && (p_Var1 != d68020_cmpi_pcix_8)) &&
              (p_Var1 != d68020_cmpi_pcdi_8)) &&
             ((p_Var1 != d68020_chk2_cmp2_32 && (p_Var1 != d68020_chk2_cmp2_16)))) &&
            (p_Var1 != d68020_chk2_cmp2_8)) &&
           ((p_Var1 != d68020_chk_32 && (p_Var1 != d68020_cas2_32)))) &&
          (((p_Var1 != d68020_cas2_16 &&
            (((p_Var1 != d68020_cas_32 && (p_Var1 != d68020_cas_16)) && (p_Var1 != d68020_cas_8))))
           && (((p_Var1 != d68020_callm && (p_Var1 != d68020_bsr_32)) && (p_Var1 != d68020_bra_32)))
           ))) && ((p_Var1 != d68020_bftst && (p_Var1 != d68020_bfset)))) &&
        ((p_Var1 != d68020_bfins &&
         (((p_Var1 != d68020_bfffo && (p_Var1 != d68020_bfextu)) && (p_Var1 != d68020_bfexts))))))))
      && (((p_Var1 != d68020_bfclr && (p_Var1 != d68020_bcc_32)) && (p_Var1 != d68020_bfchg)))))) {
switchD_003f9fbf_caseD_3:
    if (((p_Var1 != d68040_move16_al_ai) && (p_Var1 != d68040_move16_ai_al)) &&
       ((p_Var1 != d68040_move16_al_pi &&
        ((((p_Var1 != d68040_move16_pi_al && (p_Var1 != d68040_move16_pi_pi)) &&
          (p_Var1 != d68040_cinv)) && (p_Var1 != d68040_cpush)))))) {
switchD_003f9fbf_caseD_7:
      if (((p_Var1 != d68040_pflush) && (p_Var1 != d68020_cptrapcc_32)) &&
         ((p_Var1 != d68020_cptrapcc_16 &&
          ((((p_Var1 != d68020_cptrapcc_0 && (p_Var1 != d68020_cpscc)) &&
            ((p_Var1 != d68020_cpsave &&
             (((p_Var1 != d68020_cprestore && (p_Var1 != d68020_cpgen)) && (p_Var1 != d68020_cpdbcc)
              ))))) && ((p_Var1 != d68020_cpbcc_16 && (p_Var1 != d68020_cpbcc_32)))))))) {
switchD_003f9fbf_default:
        if ((0xfffffffd < cpu_type - 5) ||
           (uVar2 = 0, p_Var1 != d68020_rtm && p_Var1 != d68020_callm)) {
          uVar2 = 1;
        }
      }
    }
  }
  return uVar2;
}

Assistant:

unsigned int m68k_is_valid_instruction(unsigned int instruction, unsigned int cpu_type)
{
	if(!g_initialized)
	{
		build_opcode_table();
		g_initialized = 1;
	}

	instruction &= 0xffff;
	if(g_instruction_table[instruction] == d68000_illegal)
		return 0;

	switch(cpu_type)
	{
		case M68K_CPU_TYPE_68000:
			if(g_instruction_table[instruction] == d68010_bkpt)
				return 0;
			if(g_instruction_table[instruction] == d68010_move_fr_ccr)
				return 0;
			if(g_instruction_table[instruction] == d68010_movec)
				return 0;
			if(g_instruction_table[instruction] == d68010_moves_8)
				return 0;
			if(g_instruction_table[instruction] == d68010_moves_16)
				return 0;
			if(g_instruction_table[instruction] == d68010_moves_32)
				return 0;
			if(g_instruction_table[instruction] == d68010_rtd)
				return 0;
			// Fallthrough
		case M68K_CPU_TYPE_68010:
			if(g_instruction_table[instruction] == d68020_bcc_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_bfchg)
				return 0;
			if(g_instruction_table[instruction] == d68020_bfclr)
				return 0;
			if(g_instruction_table[instruction] == d68020_bfexts)
				return 0;
			if(g_instruction_table[instruction] == d68020_bfextu)
				return 0;
			if(g_instruction_table[instruction] == d68020_bfffo)
				return 0;
			if(g_instruction_table[instruction] == d68020_bfins)
				return 0;
			if(g_instruction_table[instruction] == d68020_bfset)
				return 0;
			if(g_instruction_table[instruction] == d68020_bftst)
				return 0;
			if(g_instruction_table[instruction] == d68020_bra_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_bsr_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_callm)
				return 0;
			if(g_instruction_table[instruction] == d68020_cas_8)
				return 0;
			if(g_instruction_table[instruction] == d68020_cas_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_cas_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_cas2_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_cas2_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_chk_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_chk2_cmp2_8)
				return 0;
			if(g_instruction_table[instruction] == d68020_chk2_cmp2_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_chk2_cmp2_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_cmpi_pcdi_8)
				return 0;
			if(g_instruction_table[instruction] == d68020_cmpi_pcix_8)
				return 0;
			if(g_instruction_table[instruction] == d68020_cmpi_pcdi_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_cmpi_pcix_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_cmpi_pcdi_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_cmpi_pcix_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_cpbcc_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_cpbcc_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_cpdbcc)
				return 0;
			if(g_instruction_table[instruction] == d68020_cpgen)
				return 0;
			if(g_instruction_table[instruction] == d68020_cprestore)
				return 0;
			if(g_instruction_table[instruction] == d68020_cpsave)
				return 0;
			if(g_instruction_table[instruction] == d68020_cpscc)
				return 0;
			if(g_instruction_table[instruction] == d68020_cptrapcc_0)
				return 0;
			if(g_instruction_table[instruction] == d68020_cptrapcc_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_cptrapcc_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_divl)
				return 0;
			if(g_instruction_table[instruction] == d68020_extb_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_link_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_mull)
				return 0;
			if(g_instruction_table[instruction] == d68020_pack_rr)
				return 0;
			if(g_instruction_table[instruction] == d68020_pack_mm)
				return 0;
			if(g_instruction_table[instruction] == d68020_rtm)
				return 0;
			if(g_instruction_table[instruction] == d68020_trapcc_0)
				return 0;
			if(g_instruction_table[instruction] == d68020_trapcc_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_trapcc_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_tst_pcdi_8)
				return 0;
			if(g_instruction_table[instruction] == d68020_tst_pcix_8)
				return 0;
			if(g_instruction_table[instruction] == d68020_tst_i_8)
				return 0;
			if(g_instruction_table[instruction] == d68020_tst_a_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_tst_pcdi_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_tst_pcix_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_tst_i_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_tst_a_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_tst_pcdi_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_tst_pcix_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_tst_i_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_unpk_rr)
				return 0;
			if(g_instruction_table[instruction] == d68020_unpk_mm)
				return 0;
			// Fallthrough
		case M68K_CPU_TYPE_68EC020:
		case M68K_CPU_TYPE_68020:
		case M68K_CPU_TYPE_68030:
		case M68K_CPU_TYPE_68EC030:
			if(g_instruction_table[instruction] == d68040_cinv)
				return 0;
			if(g_instruction_table[instruction] == d68040_cpush)
				return 0;
			if(g_instruction_table[instruction] == d68040_move16_pi_pi)
				return 0;
			if(g_instruction_table[instruction] == d68040_move16_pi_al)
				return 0;
			if(g_instruction_table[instruction] == d68040_move16_al_pi)
				return 0;
			if(g_instruction_table[instruction] == d68040_move16_ai_al)
				return 0;
			if(g_instruction_table[instruction] == d68040_move16_al_ai)
				return 0;
			// Fallthrough
		case M68K_CPU_TYPE_68040:
		case M68K_CPU_TYPE_68EC040:
		case M68K_CPU_TYPE_68LC040:
			if(g_instruction_table[instruction] == d68020_cpbcc_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_cpbcc_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_cpdbcc)
				return 0;
			if(g_instruction_table[instruction] == d68020_cpgen)
				return 0;
			if(g_instruction_table[instruction] == d68020_cprestore)
				return 0;
			if(g_instruction_table[instruction] == d68020_cpsave)
				return 0;
			if(g_instruction_table[instruction] == d68020_cpscc)
				return 0;
			if(g_instruction_table[instruction] == d68020_cptrapcc_0)
				return 0;
			if(g_instruction_table[instruction] == d68020_cptrapcc_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_cptrapcc_32)
				return 0;
			if(g_instruction_table[instruction] == d68040_pflush)
				return 0;
	}
	if(cpu_type != M68K_CPU_TYPE_68020 && cpu_type != M68K_CPU_TYPE_68EC020 &&
	  (g_instruction_table[instruction] == d68020_callm ||
	  g_instruction_table[instruction] == d68020_rtm))
		return 0;

	return 1;
}